

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O1

void __thiscall AST::LetStmt::~LetStmt(LetStmt *this)

{
  Expr *pEVar1;
  Identifier *pIVar2;
  
  (this->super_Stmt)._vptr_Stmt = (_func_int **)&PTR__LetStmt_001168e0;
  pEVar1 = (this->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
           super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl;
  if (pEVar1 != (Expr *)0x0) {
    (*(pEVar1->super_Stmt)._vptr_Stmt[1])();
  }
  (this->m_expr)._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
  super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
  super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pIVar2 = (this->m_ident)._M_t.
           super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>._M_t.
           super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
           super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl;
  if (pIVar2 != (Identifier *)0x0) {
    (**(code **)((long)(pIVar2->super_Expr).super_Stmt + 8))();
  }
  (this->m_ident)._M_t.super___uniq_ptr_impl<AST::Identifier,_std::default_delete<AST::Identifier>_>
  ._M_t.super__Tuple_impl<0UL,_AST::Identifier_*,_std::default_delete<AST::Identifier>_>.
  super__Head_base<0UL,_AST::Identifier_*,_false>._M_head_impl = (Identifier *)0x0;
  operator_delete(this,0x18);
  return;
}

Assistant:

explicit LetStmt(std::unique_ptr<Identifier> ident, std::unique_ptr<Expr> expr)
        : m_ident(std::move(ident))
        , m_expr(std::move(expr)) { }